

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
~vector(vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this
       )

{
  memory_resource *pmVar1;
  
  this->nStored = 0;
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 4,4);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }